

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pic.cpp
# Opt level: O1

Point shrinkChunk(Image *chunk)

{
  pointer pCVar1;
  value_type vVar2;
  uint uVar3;
  pointer pCVar4;
  Size SVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  value_type vVar9;
  long lVar10;
  uint8_t *puVar11;
  long lVar12;
  int iVar13;
  value_type vVar14;
  pointer pCVar15;
  pointer pCVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  value_type vVar21;
  uint8_t *puVar22;
  Image out;
  undefined8 local_70;
  uint uStack_64;
  allocator_type local_5d;
  value_type local_5c;
  value_type local_58;
  uint uStack_54;
  Image local_50;
  
  local_70._4_4_ = 0;
  vVar2 = (value_type)(chunk->size).width;
  lVar6 = (long)(int)vVar2;
  uVar3 = (chunk->size).height;
  uVar20 = 0;
  if (0 < (int)uVar3) {
    uVar20 = 0;
    pCVar4 = (chunk->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      lVar12 = uVar20 * lVar6;
      pCVar15 = pCVar4 + lVar12;
      uVar18 = (lVar12 + lVar6) * 4 + lVar12 * -4;
      pCVar1 = pCVar4 + lVar12 + lVar6;
      lVar12 = (long)uVar18 >> 4;
      pCVar16 = pCVar15;
      if (0 < lVar12) {
        pCVar16 = (pointer)(&pCVar15->r + (uVar18 & 0xfffffffffffffff0));
        lVar12 = lVar12 + 1;
        do {
          if (0xffffff < (uint)*pCVar15) goto LAB_0010d932;
          if (0xffffff < (uint)pCVar15[1]) {
            pCVar15 = pCVar15 + 1;
            goto LAB_0010d932;
          }
          if (0xffffff < (uint)pCVar15[2]) {
            pCVar15 = pCVar15 + 2;
            goto LAB_0010d932;
          }
          if (0xffffff < (uint)pCVar15[3]) {
            pCVar15 = pCVar15 + 3;
            goto LAB_0010d932;
          }
          pCVar15 = pCVar15 + 4;
          lVar12 = lVar12 + -1;
        } while (1 < lVar12);
      }
      lVar12 = (long)pCVar1 - (long)pCVar16 >> 2;
      if (lVar12 == 1) {
LAB_0010d90e:
        pCVar15 = pCVar16;
        if ((uint)*pCVar16 < 0x1000000) {
          pCVar15 = pCVar1;
        }
      }
      else if (lVar12 == 2) {
LAB_0010d901:
        pCVar15 = pCVar16;
        if ((uint)*pCVar16 < 0x1000000) {
          pCVar16 = pCVar16 + 1;
          goto LAB_0010d90e;
        }
      }
      else {
        pCVar15 = pCVar1;
        if ((lVar12 == 3) && (pCVar15 = pCVar16, (uint)*pCVar16 < 0x1000000)) {
          pCVar16 = pCVar16 + 1;
          goto LAB_0010d901;
        }
      }
LAB_0010d932:
      if (pCVar15 != pCVar1) goto LAB_0010d94b;
      uVar20 = uVar20 + 1;
      local_70._4_4_ = (undefined4)uVar20;
    } while (uVar20 != (long)(int)uVar3);
    uVar20 = (ulong)uVar3;
  }
LAB_0010d94b:
  iVar19 = (int)uVar20;
  uVar8 = uVar3;
  uStack_64 = uVar3;
  if (iVar19 < (int)(uVar3 - 1)) {
    lVar10 = (long)(int)uVar3;
    pCVar4 = (chunk->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar12 = lVar10 + -1;
    do {
      pCVar15 = pCVar4 + lVar12 * lVar6;
      lVar7 = (long)(int)((int)vVar2 * (uint)lVar10);
      uVar18 = lVar7 * 4 + lVar12 * lVar6 * -4;
      pCVar1 = pCVar4 + lVar7;
      lVar7 = (long)uVar18 >> 4;
      pCVar16 = pCVar15;
      if (0 < lVar7) {
        pCVar16 = (pointer)(&pCVar15->r + (uVar18 & 0xfffffffffffffff0));
        lVar7 = lVar7 + 1;
        do {
          if (0xffffff < (uint)*pCVar15) goto LAB_0010da4a;
          if (0xffffff < (uint)pCVar15[1]) {
            pCVar15 = pCVar15 + 1;
            goto LAB_0010da4a;
          }
          if (0xffffff < (uint)pCVar15[2]) {
            pCVar15 = pCVar15 + 2;
            goto LAB_0010da4a;
          }
          if (0xffffff < (uint)pCVar15[3]) {
            pCVar15 = pCVar15 + 3;
            goto LAB_0010da4a;
          }
          pCVar15 = pCVar15 + 4;
          lVar7 = lVar7 + -1;
        } while (1 < lVar7);
      }
      lVar7 = (long)pCVar1 - (long)pCVar16 >> 2;
      if (lVar7 == 1) {
LAB_0010da26:
        pCVar15 = pCVar16;
        if ((uint)*pCVar16 < 0x1000000) {
          pCVar15 = pCVar1;
        }
      }
      else {
        pCVar15 = pCVar16;
        if (lVar7 == 2) {
LAB_0010da19:
          if ((uint)*pCVar15 < 0x1000000) {
            pCVar16 = pCVar15 + 1;
            goto LAB_0010da26;
          }
        }
        else {
          pCVar15 = pCVar1;
          if ((lVar7 == 3) && (pCVar15 = pCVar16, (uint)*pCVar16 < 0x1000000)) {
            pCVar15 = pCVar16 + 1;
            goto LAB_0010da19;
          }
        }
      }
LAB_0010da4a:
      uVar8 = (uint)lVar10;
      if (pCVar15 != pCVar1) break;
      uStack_64 = (uint)lVar12;
      lVar12 = lVar12 + -1;
      lVar10 = lVar10 + -1;
      uVar8 = iVar19 + 1;
    } while (iVar19 < lVar12);
  }
  vVar21.r = '\0';
  vVar21.g = '\0';
  vVar21.b = '\0';
  vVar21.a = '\0';
  if (0 < (int)vVar2) {
    vVar9.r = '\0';
    vVar9.g = '\0';
    vVar9.b = '\0';
    vVar9.a = '\0';
    puVar11 = &(chunk->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
               super__Vector_impl_data._M_start[iVar19 * lVar6].a;
    do {
      iVar13 = 0xb;
      puVar22 = puVar11;
      iVar17 = uVar8 - iVar19;
      if (iVar19 < (int)uVar8) {
        do {
          if (*puVar22 != '\0') {
            iVar13 = 0xe;
            break;
          }
          puVar22 = puVar22 + lVar6 * 4;
          iVar17 = iVar17 + -1;
        } while (iVar17 != 0);
      }
      if (iVar13 != 0xb) {
        vVar21 = vVar9;
        if (iVar13 != 0xe) goto LAB_0010dc58;
        break;
      }
      vVar9 = (value_type)((int)vVar9 + 1);
      puVar11 = puVar11 + 4;
      vVar21 = vVar2;
    } while (vVar2 != vVar9);
  }
  local_70 = CONCAT44(local_70._4_4_,vVar21);
  vVar9 = vVar2;
  if ((int)vVar21 < (int)((int)vVar2 - 1U)) {
    local_5c = (value_type)((int)vVar21 + 1);
    lVar12 = (long)(int)vVar2 + -1;
    puVar11 = &(chunk->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
               super__Vector_impl_data._M_start[iVar19 * lVar6 + (long)(int)vVar2 + -1].a;
    vVar14 = vVar2;
    do {
      iVar13 = 0x12;
      puVar22 = puVar11;
      iVar17 = uVar8 - iVar19;
      if (iVar19 < (int)uVar8) {
        do {
          if (*puVar22 != '\0') {
            iVar13 = 0x15;
            break;
          }
          puVar22 = puVar22 + lVar6 * 4;
          iVar17 = iVar17 + -1;
        } while (iVar17 != 0);
      }
      if (iVar13 != 0x12) {
        vVar9 = vVar14;
        if (iVar13 != 0x15) goto LAB_0010dc58;
        break;
      }
      vVar14 = SUB84(lVar12,0);
      lVar12 = lVar12 + -1;
      puVar11 = puVar11 + -4;
      vVar9 = local_5c;
    } while ((int)vVar21 < lVar12);
  }
  local_50.size.width = 0;
  local_50.size.height = 0;
  if ((local_70 != 0) ||
     (SVar5.height = uStack_64, SVar5.width._0_1_ = vVar9.r, SVar5.width._1_1_ = vVar9.g,
     SVar5.width._2_1_ = vVar9.b, SVar5.width._3_1_ = vVar9.a, local_58 = vVar2, uStack_54 = uVar3,
     SVar5 != chunk->size)) {
    uVar8 = uVar8 - iVar19;
    if (uVar8 != 0) {
      local_50.size.height = uVar8;
      local_50.size.width = (int)vVar9 - (int)vVar21;
      local_58.r = '\0';
      local_58.g = '\0';
      local_58.b = '\0';
      local_58.a = '\0';
      std::vector<Color,_std::allocator<Color>_>::vector
                (&local_50.colorData,
                 (long)(((ulong)uVar8 << 0x20) * (ulong)(uint)((int)vVar9 - (int)vVar21)) >> 0x20,
                 &local_58,&local_5d);
      uVar20 = uVar20 << 0x20;
      uVar18 = (ulong)(uint)vVar21;
      Image::drawOnto(chunk,&local_50,(Point)0x0,(Point)(uVar20 + uVar18),local_50.size);
      chunk->size = local_50.size;
      std::vector<Color,_std::allocator<Color>_>::_M_move_assign
                (&chunk->colorData,&local_50.colorData);
      if (local_50.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl
                        .super__Vector_impl_data._M_start,
                        (long)local_50.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_50.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_0010dc5e;
    }
    (chunk->size).width = 1;
    (chunk->size).height = 1;
    std::vector<Color,_std::allocator<Color>_>::resize(&chunk->colorData,(long)(chunk->size).height)
    ;
  }
LAB_0010dc58:
  uVar18 = 0;
  uVar20 = 0;
LAB_0010dc5e:
  return (Point)(uVar18 | uVar20);
}

Assistant:

Point shrinkChunk(Image& chunk) {
	Point start {0, 0};
	Point end {chunk.size.width, chunk.size.height};
	for (; start.y < end.y; start.y++) { // Shrink from top
		if (std::any_of(&chunk.pixel(start.x, start.y), &chunk.pixel(end.x, start.y), [](Color c){ return c.a > 0; })) {
			break;
		}
	}
	for (; start.y < end.y - 1; end.y--) { // Shrink from bottom
		if (std::any_of(&chunk.pixel(start.x, end.y - 1), &chunk.pixel(end.x, end.y - 1), [](Color c){ return c.a > 0; })) {
			break;
		}
	}
	for (; start.x < end.x; start.x++) { // Shrink from left
		for (int y = start.y; y < end.y; y++) {
			if (chunk.pixel(start.x, y).a > 0)
				goto leftfound;
		}
	}
leftfound:
	for(; start.x < end.x - 1; end.x--) { // Shrink from right
		for (int y = start.y; y < end.y; y++) {
			if (chunk.pixel(end.x - 1, y).a > 0)
				goto rightfound;
		}
	}
rightfound:
	if (start == Point{0, 0} && end == Point{chunk.size.width, chunk.size.height}) {
		// No resizing possible
		return {0, 0};
	} else if (start.y == end.y) {
		// TODO: Be able to remove empty chunks
		chunk.fastResize({1, 1});
		return {0, 0};
	} else {
		Image out({end.x - start.x, end.y - start.y});
		chunk.drawOnto(out, {0, 0}, {start.x, start.y}, out.size);
		chunk = std::move(out);
		return {start.x, start.y};
	}
}